

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Option<Catch::TagAlias> * __thiscall
Catch::TagAliasRegistry::find
          (Option<Catch::TagAlias> *__return_storage_ptr__,TagAliasRegistry *this,string *alias)

{
  const_iterator cVar1;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
          ::find(&(this->m_registry)._M_t,alias);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->m_registry)._M_t._M_impl.super__Rb_tree_header) {
    __return_storage_ptr__->nullableValue = (TagAlias *)0x0;
  }
  else {
    Option<Catch::TagAlias>::Option(__return_storage_ptr__,(TagAlias *)(cVar1._M_node + 2));
  }
  return __return_storage_ptr__;
}

Assistant:

Option<TagAlias> TagAliasRegistry::find( std::string const& alias ) const {
        std::map<std::string, TagAlias>::const_iterator it = m_registry.find( alias );
        if( it != m_registry.end() )
            return it->second;
        else
            return Option<TagAlias>();
    }